

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# consolelog.hpp
# Opt level: O0

void __thiscall github111116::ConsoleLogger::log<char[45]>(ConsoleLogger *this,char (*args) [45])

{
  ConsoleLogger *in_RSI;
  char (*in_RDI) [45];
  
  if (*(int *)(in_RDI[2] + 0x12) < 1) {
    std::mutex::lock((mutex *)in_RSI);
    std::operator<<(*(ostream **)*in_RDI,"    ");
    print<char[45]>(in_RSI,in_RDI);
    std::mutex::unlock((mutex *)0x10e110);
  }
  return;
}

Assistant:

void ConsoleLogger::log(const Args&... args)
{
	if (loglevel > 0) return;
	mtx.lock();
	out << "    ";
	print(args...);
	mtx.unlock();
}